

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall despot::TabularCPT::Validate(TabularCPT *this)

{
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars;
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  int c;
  uint index_00;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  int i;
  ulong uVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  vector<int,_std::allocator<int>_> index;
  double local_58;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  uVar1 = (*(this->super_CPT).super_Function._vptr_Function[7])();
  uVar2 = (*(this->super_CPT).super_Function._vptr_Function[9])(this);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  index_00 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    index_00 = 0;
    uVar5 = uVar1;
  }
  while( true ) {
    if (index_00 == uVar5) goto LAB_001571f9;
    local_58 = 0.0;
    for (uVar7 = 0; uVar2 != (uint)uVar7; uVar7 = (ulong)((uint)uVar7 + 1)) {
      (*(this->super_CPT).super_Function._vptr_Function[4])(this,(ulong)index_00,uVar7);
      local_58 = local_58 + extraout_XMM0_Qa;
    }
    if (1e-06 < ABS(local_58 + -1.0)) break;
    index_00 = index_00 + 1;
  }
  vars = &(this->super_CPT).super_Function.parents_;
  Variable::ComputeIndexVec((vector<int,_std::allocator<int>_> *)&local_48,vars,index_00);
  std::operator<<((ostream *)&std::cerr,"ERROR: Probabilities do not sum to one when parents = [");
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_48._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar7 = uVar7 + 1) {
    pcVar4 = ", ";
    if (uVar7 == 0) {
      pcVar4 = "";
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(vars->
                                     super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar7]->name_);
    poVar3 = std::operator<<(poVar3,"=");
    std::operator<<(poVar3,(string *)
                           ((long)local_48._M_impl.super__Vector_impl_data._M_start[uVar7] * 0x20 +
                           *(long *)&((vars->
                                      super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar7]->
                                     super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data));
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cerr," Sum = ");
  poVar3 = std::ostream::_M_insert<double>(local_58);
  std::operator<<(poVar3,"; Entries: [");
  lVar6 = 0;
  for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
    pcVar4 = ", ";
    if (lVar6 == 0) {
      pcVar4 = "";
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
    poVar3 = std::operator<<(poVar3,(string *)
                                    ((long)&(((((this->super_CPT).super_Function.child_)->
                                              super_Variable).values_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar6));
    std::operator<<(poVar3,"=");
    (*(this->super_CPT).super_Function._vptr_Function[4])(this,(ulong)index_00,uVar7 & 0xffffffff);
    std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
    lVar6 = lVar6 + 0x20;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
LAB_001571f9:
  return (int)uVar1 <= (int)index_00;
}

Assistant:

bool TabularCPT::Validate() const {
	int parent_size = ParentSize(), child_size = ChildSize();

	for (int p = 0; p < parent_size; p++) {
		double sum = 0;
		for (int c = 0; c < child_size; c++) {
			sum += GetValue(p, c);
		}

		if (fabs(sum - 1.0) > 1e-6) {
			vector<int> index = Variable::ComputeIndexVec(parents_, p);
			cerr << "ERROR: Probabilities do not sum to one when parents = [";
			for (int i = 0; i < index.size(); i++) {
				cerr << (i == 0 ? "" : ", ") << parents_[i]->name() << "="
					<< parents_[i]->GetValue(index[i]);
			}
			cerr << "]" << endl;

			cerr << " Sum = " << sum << "; Entries: [";
			for (int i = 0; i < child_size; i++) {
				cerr << (i == 0 ? "" : ", ") << child_->GetValue(i) << "="
					<< GetValue(p, i);
			}
			cerr << "]" << endl;

			return false;
		}
	}

	return true;
}